

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O1

void nn_cinproc_destroy(nn_epbase *self)

{
  if (self != (nn_epbase *)0x0) {
    self = (nn_epbase *)(self + -6);
  }
  nn_sinproc_term((nn_sinproc *)&((nn_fsm *)((long)self + 0x58))->stopped);
  nn_fsm_term((nn_fsm *)self);
  nn_ins_item_term((nn_ins_item *)&((nn_fsm *)((long)self + 0x58))->shutdown_fn);
  nn_free(self);
  return;
}

Assistant:

static void nn_cinproc_destroy (struct nn_epbase *self)
{
    struct nn_cinproc *cinproc;

    cinproc = nn_cont (self, struct nn_cinproc, item.epbase);

    nn_sinproc_term (&cinproc->sinproc);
    nn_fsm_term (&cinproc->fsm);
    nn_ins_item_term (&cinproc->item);

    nn_free (cinproc);
}